

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_auth_act(Curl_easy *data)

{
  connectdata *conn_00;
  _Bool _Var1;
  char *pcVar2;
  unsigned_long local_30;
  unsigned_long authmask;
  CURLcode result;
  _Bool pickproxy;
  _Bool pickhost;
  connectdata *conn;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  authmask._7_1_ = false;
  authmask._6_1_ = false;
  authmask._0_4_ = CURLE_OK;
  local_30 = 0xffffffffffffffff;
  if ((data->set).str[0x41] == (char *)0x0) {
    local_30 = 0xffffffffffffffbf;
  }
  if (((data->req).httpcode < 100) || (199 < (data->req).httpcode)) {
    if ((*(uint *)&(data->state).field_0x660 >> 5 & 1) == 0) {
      if ((((*(ulong *)&(conn_00->bits).field_0x4 >> 0xb & 1) != 0) ||
          ((data->set).str[0x41] != (char *)0x0)) &&
         (((data->req).httpcode == 0x191 ||
          (((*(ulong *)&(conn_00->bits).field_0x4 >> 0x11 & 1) != 0 && ((data->req).httpcode < 300))
          )))) {
        authmask._7_1_ = pickoneauth(&(data->state).authhost,local_30);
        if (!authmask._7_1_) {
          *(uint *)&(data->state).field_0x660 =
               *(uint *)&(data->state).field_0x660 & 0xffffffdf | 0x20;
        }
        if (((data->state).authhost.picked == 8) && (0xb < conn_00->httpversion)) {
          Curl_infof(data,"Forcing HTTP/1.1 for NTLM");
          Curl_conncontrol(conn_00,1);
          (data->state).httpwant = '\x02';
        }
      }
      if ((((*(ulong *)&(conn_00->bits).field_0x4 >> 2 & 1) != 0) &&
          (((data->req).httpcode == 0x197 ||
           (((*(ulong *)&(conn_00->bits).field_0x4 >> 0x11 & 1) != 0 && ((data->req).httpcode < 300)
            ))))) &&
         (authmask._6_1_ = pickoneauth(&(data->state).authproxy,local_30 & 0xffffffffffffffbf),
         !authmask._6_1_)) {
        *(uint *)&(data->state).field_0x660 =
             *(uint *)&(data->state).field_0x660 & 0xffffffdf | 0x20;
      }
      if ((authmask._7_1_ == false) && (authmask._6_1_ == false)) {
        if ((((data->req).httpcode < 300) && (((data->state).authhost.field_0x18 & 1) == 0)) &&
           (((*(ulong *)&(conn_00->bits).field_0x4 >> 0x11 & 1) != 0 &&
            (((data->state).httpreq != HTTPREQ_GET && ((data->state).httpreq != HTTPREQ_HEAD)))))) {
          pcVar2 = (*Curl_cstrdup)((data->state).url);
          (data->req).newurl = pcVar2;
          if ((data->req).newurl == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          (data->state).authhost.field_0x18 = (data->state).authhost.field_0x18 & 0xfe | 1;
        }
      }
      else {
        if (((data->state).httpreq != HTTPREQ_GET) &&
           ((((data->state).httpreq != HTTPREQ_HEAD &&
             ((*(ulong *)&(conn_00->bits).field_0x4 >> 0x12 & 1) == 0)) &&
            (authmask._0_4_ = http_perhapsrewind(data,conn_00), (CURLcode)authmask != CURLE_OK)))) {
          return (CURLcode)authmask;
        }
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        pcVar2 = (*Curl_cstrdup)((data->state).url);
        (data->req).newurl = pcVar2;
        if ((data->req).newurl == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      _Var1 = http_should_fail(data);
      if (_Var1) {
        Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
        authmask._0_4_ = CURLE_HTTP_RETURNED_ERROR;
      }
      data_local._4_4_ = (CURLcode)authmask;
    }
    else {
      data_local._4_4_ = CURLE_OK;
      if ((*(ulong *)&(data->set).field_0x9a0 >> 0x14 & 1) != 0) {
        data_local._4_4_ = CURLE_HTTP_RETURNED_ERROR;
      }
    }
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_auth_act(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;
  unsigned long authmask = ~0ul;

  if(!data->set.str[STRING_BEARER])
    authmask &= (unsigned long)~CURLAUTH_BEARER;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if((conn->bits.user_passwd || data->set.str[STRING_BEARER]) &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost, authmask);
    if(!pickhost)
      data->state.authproblem = TRUE;
    if(data->state.authhost.picked == CURLAUTH_NTLM &&
       conn->httpversion > 11) {
      infof(data, "Forcing HTTP/1.1 for NTLM");
      connclose(conn, "Force HTTP/1.1 connection");
      data->state.httpwant = CURL_HTTP_VERSION_1_1;
    }
  }
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy,
                            authmask & ~CURLAUTH_BEARER);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }
#endif

  if(pickhost || pickproxy) {
    if((data->state.httpreq != HTTPREQ_GET) &&
       (data->state.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(data, conn);
      if(result)
        return result;
    }
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->state.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->state.httpreq != HTTPREQ_GET) &&
       (data->state.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->state.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(data)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}